

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.h
# Opt level: O1

void * __thiscall
CPrsArrayList::realloc_mem(CPrsArrayList *this,void *p,size_t oldsiz,size_t newsiz)

{
  void *pvVar1;
  
  pvVar1 = CTcPrsMem::alloc(G_prsmem,newsiz);
  pvVar1 = memcpy(pvVar1,p,oldsiz);
  return pvVar1;
}

Assistant:

virtual void *realloc_mem(void *p, size_t oldsiz, size_t newsiz)
    {
        void *pnew;

        /* allocate a new block from the parser pool */
        pnew = G_prsmem->alloc(newsiz);

        /* copy from the old block to the new block */
        memcpy(pnew, p, oldsiz);

        /* return the new block */
        return pnew;
    }